

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

void __thiscall
OSTEI_VRR_Algorithm_Base::Create_WithOrder(OSTEI_VRR_Algorithm_Base *this,QAM *q,IdxOrder idx_order)

{
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  local_80;
  undefined1 local_50 [48];
  
  QAM::QAM((QAM *)local_50,q);
  GenerateQuartetTargets((QuartetSet *)&local_80,(QAM *)local_50);
  Create_WithOrder(this,(QuartetSet *)&local_80,idx_order);
  std::
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  ::~_Rb_tree(&local_80);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create_WithOrder(QAM q, IdxOrder idx_order)
{
    Create_WithOrder(GenerateQuartetTargets(q), idx_order);
}